

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_dialer_close(nng_dialer did)

{
  nni_dialer *pnStack_18;
  int rv;
  nni_dialer *d;
  nng_dialer did_local;
  
  d._0_4_ = did.id;
  d._4_4_ = nni_dialer_find(&stack0xffffffffffffffe8,did.id);
  if (d._4_4_ == 0) {
    nni_dialer_close(pnStack_18);
    d._4_4_ = 0;
  }
  return d._4_4_;
}

Assistant:

int
nng_dialer_close(nng_dialer did)
{
	nni_dialer *d;
	int         rv;

	if ((rv = nni_dialer_find(&d, did.id)) != 0) {
		return (rv);
	}
	nni_dialer_close(d);
	return (0);
}